

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
mpt::unique_array<mpt::item<mpt::layout::graph>_>::unique_array
          (unique_array<mpt::item<mpt::layout::graph>_> *this,long len)

{
  content<mpt::item<mpt::layout::graph>_> *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  default_data *pdVar3;
  
  (this->_ref)._ref = (content<mpt::item<mpt::layout::graph>_> *)0x0;
  if (unique_array<mpt::item<mpt::layout::graph>>::unique_array(long)::_dummy == '\0') {
    iVar2 = __cxa_guard_acquire(&unique_array<mpt::item<mpt::layout::graph>>::unique_array(long)::
                                 _dummy);
    if (iVar2 != 0) {
      unique_array::_dummy.super_content<mpt::item<mpt::layout::graph>_>.super_buffer.
      _content_traits = type_properties<mpt::item<mpt::layout::graph>_>::traits();
      unique_array::_dummy.super_content<mpt::item<mpt::layout::graph>_>.super_buffer._size = 0;
      unique_array::_dummy.super_content<mpt::item<mpt::layout::graph>_>.super_buffer._used = 0;
      unique_array::_dummy.super_content<mpt::item<mpt::layout::graph>_>.super_buffer._vptr_buffer =
           (_func_int **)&PTR_get_flags_0014f038;
      __cxa_guard_release(&unique_array<mpt::item<mpt::layout::graph>>::unique_array(long)::_dummy);
    }
  }
  if (len < 0) {
    pdVar3 = &unique_array::_dummy;
  }
  else {
    iVar2 = (*unique_array::_dummy.super_content<mpt::item<mpt::layout::graph>_>.super_buffer.
              _vptr_buffer[3])(&unique_array::_dummy,len << 5);
    pdVar3 = (default_data *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = (this->_ref)._ref;
  if (pcVar1 != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
    (*(pcVar1->super_buffer)._vptr_buffer[1])();
  }
  if (&pdVar3->super_content<mpt::item<mpt::layout::graph>_> ==
      (content<mpt::item<mpt::layout::graph>_> *)0x0) {
    pdVar3 = &unique_array::_dummy;
  }
  (this->_ref)._ref = &pdVar3->super_content<mpt::item<mpt::layout::graph>_>;
  return;
}

Assistant:

unique_array(long len = -1)
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		_ref.set_instance(data ? data : &_dummy);
	}